

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesDecoder::
DecodePoints<5,draco::PointAttributeVectorOutputIterator<unsigned_int>>
          (KdTreeAttributesDecoder *this,int total_dimensionality,int num_expected_points,
          DecoderBuffer *in_buffer,PointAttributeVectorOutputIterator<unsigned_int> *out_iterator)

{
  bool bVar1;
  uint32_t in_EDX;
  DynamicIntegerPointsKdTreeDecoder<5> decoder;
  undefined4 in_stack_fffffffffffffbb0;
  uint32_t in_stack_fffffffffffffbb4;
  PointAttributeVectorOutputIterator<unsigned_int> *oit;
  undefined7 in_stack_fffffffffffffbc0;
  undefined1 in_stack_fffffffffffffbc7;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  PointAttributeVectorOutputIterator<unsigned_int> local_428 [3];
  uint32_t in_stack_fffffffffffffcac;
  DynamicIntegerPointsKdTreeDecoder<5> *in_stack_fffffffffffffcb0;
  bool local_1;
  
  oit = local_428;
  DynamicIntegerPointsKdTreeDecoder<5>::DynamicIntegerPointsKdTreeDecoder
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
  bVar1 = DynamicIntegerPointsKdTreeDecoder<5>::
          DecodePoints<draco::PointAttributeVectorOutputIterator<unsigned_int>>
                    ((DynamicIntegerPointsKdTreeDecoder<5> *)
                     CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                     (DecoderBuffer *)CONCAT17(in_stack_fffffffffffffbc7,in_stack_fffffffffffffbc0),
                     oit,in_stack_fffffffffffffbb4);
  if ((bVar1) &&
     (in_stack_fffffffffffffbb4 =
           DynamicIntegerPointsKdTreeDecoder<5>::num_decoded_points
                     ((DynamicIntegerPointsKdTreeDecoder<5> *)local_428),
     in_stack_fffffffffffffbb4 == in_EDX)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  DynamicIntegerPointsKdTreeDecoder<5>::~DynamicIntegerPointsKdTreeDecoder
            ((DynamicIntegerPointsKdTreeDecoder<5> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
  return local_1;
}

Assistant:

bool KdTreeAttributesDecoder::DecodePoints(int total_dimensionality,
                                           int num_expected_points,
                                           DecoderBuffer *in_buffer,
                                           OutIteratorT *out_iterator) {
  DynamicIntegerPointsKdTreeDecoder<level_t> decoder(total_dimensionality);
  if (!decoder.DecodePoints(in_buffer, *out_iterator, num_expected_points) ||
      decoder.num_decoded_points() != num_expected_points) {
    return false;
  }
  return true;
}